

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginRenderPass
          (VulkanCommandBuffer *this,VkRenderPass RenderPass,VkFramebuffer Framebuffer,
          uint32_t FramebufferWidth,uint32_t FramebufferHeight,uint32_t ClearValueCount,
          VkClearValue *pClearValues)

{
  undefined4 in_register_0000000c;
  undefined1 local_70 [32];
  VkOffset2D local_50;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  VkClearValue *local_38;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_70,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,FramebufferWidth));
    Diligent::DebugAssertionFailed
              ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x128);
    if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),local_70._16_8_ + 1);
    }
  }
  if ((this->m_State).RenderPass != (VkRenderPass)0x0) {
    Diligent::FormatString<char[32]>
              ((string *)local_70,(char (*) [32])"Current pass has not been ended");
    Diligent::DebugAssertionFailed
              ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x129);
    if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),local_70._16_8_ + 1);
    }
  }
  if ((this->m_State).DynamicRenderingHash != 0) {
    Diligent::FormatString<char[47]>
              ((string *)local_70,(char (*) [47])"Current dynamic render pass has not been ended");
    Diligent::DebugAssertionFailed
              ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x12a);
    if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),local_70._16_8_ + 1);
    }
  }
  if (((this->m_State).RenderPass != RenderPass) || ((this->m_State).Framebuffer != Framebuffer)) {
    FlushBarriers(this);
    local_70._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
    local_70._8_8_ = (void *)0x0;
    local_50.x = 0;
    local_50.y = 0;
    local_38 = pClearValues;
    local_70._16_8_ = RenderPass;
    local_70._24_8_ = Framebuffer;
    local_48 = FramebufferWidth;
    local_44 = FramebufferHeight;
    local_40 = ClearValueCount;
    (*vkCmdBeginRenderPass)
              (this->m_VkCmdBuffer,(VkRenderPassBeginInfo *)local_70,VK_SUBPASS_CONTENTS_INLINE);
    (this->m_State).RenderPass = RenderPass;
    (this->m_State).Framebuffer = Framebuffer;
    (this->m_State).FramebufferWidth = FramebufferWidth;
    (this->m_State).FramebufferHeight = FramebufferHeight;
  }
  return;
}

Assistant:

__forceinline void BeginRenderPass(VkRenderPass        RenderPass,
                                       VkFramebuffer       Framebuffer,
                                       uint32_t            FramebufferWidth,
                                       uint32_t            FramebufferHeight,
                                       uint32_t            ClearValueCount = 0,
                                       const VkClearValue* pClearValues    = nullptr)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(m_State.RenderPass == VK_NULL_HANDLE, "Current pass has not been ended");
        VERIFY(m_State.DynamicRenderingHash == 0, "Current dynamic render pass has not been ended");

        if (m_State.RenderPass != RenderPass || m_State.Framebuffer != Framebuffer)
        {
            FlushBarriers();

            VkRenderPassBeginInfo BeginInfo;
            BeginInfo.sType       = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
            BeginInfo.pNext       = nullptr;
            BeginInfo.renderPass  = RenderPass;
            BeginInfo.framebuffer = Framebuffer;
            // The render area MUST be contained within the framebuffer dimensions (7.4)
            BeginInfo.renderArea      = {{0, 0}, {FramebufferWidth, FramebufferHeight}};
            BeginInfo.clearValueCount = ClearValueCount;
            BeginInfo.pClearValues    = pClearValues; // an array of VkClearValue structures that contains clear values for
                                                      // each attachment, if the attachment uses a loadOp value of VK_ATTACHMENT_LOAD_OP_CLEAR
                                                      // or if the attachment has a depth/stencil format and uses a stencilLoadOp value of
                                                      // VK_ATTACHMENT_LOAD_OP_CLEAR. The array is indexed by attachment number. Only elements
                                                      // corresponding to cleared attachments are used. Other elements of pClearValues are
                                                      // ignored (7.4)

            vkCmdBeginRenderPass(m_VkCmdBuffer, &BeginInfo,
                                 VK_SUBPASS_CONTENTS_INLINE // the contents of the subpass will be recorded inline in the
                                                            // primary command buffer, and secondary command buffers must not
                                                            // be executed within the subpass
            );
            m_State.RenderPass        = RenderPass;
            m_State.Framebuffer       = Framebuffer;
            m_State.FramebufferWidth  = FramebufferWidth;
            m_State.FramebufferHeight = FramebufferHeight;
        }
    }